

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O0

void PWM_Update(void *info,UINT32 length,DEV_SMPL **buf)

{
  DEV_SMPL DVar1;
  DEV_SMPL DVar2;
  uint local_34;
  UINT32 i;
  DEV_SMPL tmpOutR;
  DEV_SMPL tmpOutL;
  pwm_chip *chip;
  DEV_SMPL **buf_local;
  UINT32 length_local;
  void *info_local;
  
  if (*(char *)((long)info + 0xd) == '\0') {
    DVar1 = PWM_Update_Scale((pwm_chip *)info,*(INT16 *)((long)info + 0x10));
    DVar2 = PWM_Update_Scale((pwm_chip *)info,*(INT16 *)((long)info + 0xe));
    for (local_34 = 0; local_34 < length; local_34 = local_34 + 1) {
      (*buf)[local_34] = DVar1;
      buf[1][local_34] = DVar2;
    }
  }
  else {
    memset(*buf,0,(ulong)length << 2);
    memset(buf[1],0,(ulong)length << 2);
  }
  return;
}

Assistant:

static void PWM_Update(void* info, UINT32 length, DEV_SMPL **buf)
{
	pwm_chip* chip = (pwm_chip*)info;
	DEV_SMPL tmpOutL;
	DEV_SMPL tmpOutR;
	UINT32 i;
	
	if (chip->PWM_Mute)
	{
		memset(buf[0], 0, length * sizeof(DEV_SMPL));
		memset(buf[1], 0, length * sizeof(DEV_SMPL));
		return;
	}
	
	// New PWM scaling algorithm provided by Chilly Willy on the Sonic Retro forums.
	tmpOutL = PWM_Update_Scale(chip, (INT16)chip->PWM_Out_L);
	tmpOutR = PWM_Update_Scale(chip, (INT16)chip->PWM_Out_R);
	
	for (i = 0; i < length; i ++)
	{
		buf[0][i] = tmpOutL;
		buf[1][i] = tmpOutR;
	}
	
	return;
}